

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexPolyhedron.cpp
# Opt level: O3

void __thiscall cbtConvexPolyhedron::initialize2(cbtConvexPolyhedron *this)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  cbtVector3 *pcVar7;
  cbtFace *pcVar8;
  int *piVar9;
  float fVar10;
  bool bVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  float local_30;
  float local_2c;
  float local_28;
  
  auVar26 = ZEXT816(0) << 0x40;
  auVar27 = ZEXT1664(auVar26);
  *(undefined1 (*) [16])(this->m_localCenter).m_floats = auVar26;
  iVar14 = (this->m_faces).m_size;
  lVar12 = (long)iVar14;
  if (lVar12 < 1) {
    fVar28 = 0.0;
    fVar29 = 0.0;
  }
  else {
    pcVar7 = (this->m_vertices).m_data;
    pcVar8 = (this->m_faces).m_data;
    fVar29 = 0.0;
    fVar28 = 0.0;
    lVar15 = 0;
    do {
      iVar5 = pcVar8[lVar15].m_indices.m_size;
      if (2 < iVar5) {
        piVar9 = pcVar8[lVar15].m_indices.m_data;
        lVar18 = 0;
        iVar6 = *piVar9;
        uVar17 = (ulong)(uint)piVar9[1];
        do {
          iVar16 = (int)uVar17;
          uVar17 = (ulong)piVar9[lVar18 + 2];
          fVar1 = pcVar7[iVar6].m_floats[2];
          lVar18 = lVar18 + 1;
          uVar13 = *(ulong *)pcVar7[uVar17].m_floats;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = uVar13;
          fVar10 = fVar1 - pcVar7[uVar17].m_floats[2];
          uVar2 = *(ulong *)pcVar7[iVar6].m_floats;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = uVar2;
          uVar3 = *(ulong *)pcVar7[iVar16].m_floats;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = uVar3;
          auVar33 = vsubps_avx(auVar23,auVar33);
          auVar35 = vsubps_avx(auVar23,auVar35);
          auVar26 = vmovshdup_avx(auVar33);
          auVar24 = ZEXT416((uint)(fVar1 - pcVar7[iVar16].m_floats[2]));
          auVar21 = vmulss_avx512f(auVar26,auVar24);
          auVar23 = vmovshdup_avx(auVar35);
          auVar22 = vfmsub231ss_avx512f(auVar21,auVar23,ZEXT416((uint)fVar10));
          auVar21 = vfmsub231ss_fma(ZEXT416((uint)(fVar10 * auVar35._0_4_)),auVar33,auVar24);
          auVar26 = vfmsub231ss_fma(ZEXT416((uint)(auVar33._0_4_ * auVar23._0_4_)),auVar35,auVar26);
          auVar23 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar21._0_4_ * auVar21._0_4_)),auVar22,
                                        auVar22);
          auVar26 = vfmadd231ss_fma(auVar23,auVar26,auVar26);
          auVar26 = vsqrtss_avx(auVar26,auVar26);
          fVar10 = auVar26._0_4_ * 0.5;
          fVar29 = fVar10 + fVar29;
          fVar28 = fVar28 + fVar10 * (pcVar7[uVar17].m_floats[2] +
                                     fVar1 + pcVar7[iVar16].m_floats[2]) * 0.33333334;
          auVar26._0_4_ =
               auVar27._0_4_ + fVar10 * ((float)uVar13 + (float)uVar3 + (float)uVar2) * 0.33333334;
          auVar26._4_4_ =
               auVar27._4_4_ +
               fVar10 * ((float)(uVar13 >> 0x20) + (float)(uVar3 >> 0x20) + (float)(uVar2 >> 0x20))
                        * 0.33333334;
          auVar26._8_4_ = auVar27._8_4_ + fVar10 * 0.0;
          auVar26._12_4_ = auVar27._12_4_ + fVar10 * 0.0;
          auVar27 = ZEXT1664(auVar26);
          uVar4 = vmovlps_avx(auVar26);
          *(undefined8 *)(this->m_localCenter).m_floats = uVar4;
          (this->m_localCenter).m_floats[2] = fVar28;
        } while ((ulong)(iVar5 - 1) - 1 != lVar18);
      }
      auVar26 = auVar27._0_16_;
      lVar15 = lVar15 + 1;
    } while (lVar15 != lVar12);
  }
  fVar29 = 1.0 / fVar29;
  auVar21._0_4_ = fVar29 * auVar26._0_4_;
  auVar21._4_4_ = fVar29 * auVar26._4_4_;
  auVar21._8_4_ = fVar29 * auVar26._8_4_;
  auVar21._12_4_ = fVar29 * auVar26._12_4_;
  auVar27 = ZEXT464(0x7f7fffff);
  uVar4 = vmovlps_avx(auVar21);
  *(undefined8 *)(this->m_localCenter).m_floats = uVar4;
  (this->m_localCenter).m_floats[2] = fVar29 * fVar28;
  this->m_radius = 3.4028235e+38;
  auVar26 = auVar27._0_16_;
  if (0 < iVar14) {
    auVar34 = ZEXT464(0x7f7fffff);
    auVar22._8_4_ = 0x7fffffff;
    auVar22._0_8_ = 0x7fffffff7fffffff;
    auVar22._12_4_ = 0x7fffffff;
    pcVar8 = (this->m_faces).m_data;
    auVar23 = vmovshdup_avx(auVar21);
    lVar15 = 0;
    do {
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(auVar23._0_4_ *
                                              *(float *)((long)pcVar8->m_plane + lVar15 + 4))),
                                auVar21,ZEXT416(*(uint *)((long)pcVar8->m_plane + lVar15)));
      auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)(fVar29 * fVar28)),
                                ZEXT416(*(uint *)((long)pcVar8->m_plane + lVar15 + 8)));
      auVar26 = vandps_avx(ZEXT416((uint)(auVar26._0_4_ +
                                         *(float *)((long)pcVar8->m_plane + lVar15 + 0xc))),auVar22)
      ;
      if (auVar26._0_4_ < auVar34._0_4_) {
        auVar34 = ZEXT1664(auVar26);
        this->m_radius = auVar26._0_4_;
      }
      auVar26 = auVar34._0_16_;
      lVar15 = lVar15 + 0x30;
    } while (lVar12 * 0x30 != lVar15);
  }
  lVar12 = (long)(this->m_vertices).m_size;
  if (lVar12 < 1) {
    auVar25 = ZEXT816(0x7f7fffffff7fffff);
    auVar24 = ZEXT816(0xff7fffff7f7fffff);
    auVar34 = ZEXT464(0xff7fffff);
  }
  else {
    auVar34 = ZEXT464(0xff7fffff);
    auVar27 = ZEXT464(0x7f7fffff);
    pcVar7 = (this->m_vertices).m_data;
    lVar15 = 0;
    auVar23 = ZEXT816(0x7f7fffffff7fffff);
    auVar33 = ZEXT816(0xff7fffff7f7fffff);
    do {
      uVar17 = *(ulong *)((long)pcVar7->m_floats + lVar15);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar17;
      auVar35 = vblendps_avx(auVar31,auVar33,2);
      auVar21 = vinsertps_avx(auVar33,auVar31,0x50);
      auVar22 = vinsertps_avx(auVar23,auVar31,0x50);
      uVar13 = vcmpps_avx512vl(auVar35,auVar21,1);
      auVar35 = vblendps_avx(auVar31,auVar23,2);
      uVar2 = vcmpps_avx512vl(auVar22,auVar35,1);
      lVar18 = lVar15 + 8;
      lVar15 = lVar15 + 0x10;
      bVar11 = (bool)((byte)uVar13 & 1);
      iVar14 = (int)(uVar17 >> 0x20);
      auVar24._0_4_ = (uint)bVar11 * (int)uVar17 | (uint)!bVar11 * auVar33._0_4_;
      bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
      auVar24._4_4_ = (uint)bVar11 * iVar14 | (uint)!bVar11 * auVar33._4_4_;
      auVar24._8_4_ = (uint)!(bool)((byte)(uVar13 >> 2) & 1) * auVar33._8_4_;
      auVar24._12_4_ = (uint)!(bool)((byte)(uVar13 >> 3) & 1) * auVar33._12_4_;
      bVar11 = (bool)((byte)uVar2 & 1);
      auVar25._0_4_ = (uint)bVar11 * (int)uVar17 | (uint)!bVar11 * auVar23._0_4_;
      bVar11 = (bool)((byte)(uVar2 >> 1) & 1);
      auVar25._4_4_ = (uint)bVar11 * iVar14 | (uint)!bVar11 * auVar23._4_4_;
      auVar25._8_4_ = (uint)!(bool)((byte)(uVar2 >> 2) & 1) * auVar23._8_4_;
      auVar25._12_4_ = (uint)!(bool)((byte)(uVar2 >> 3) & 1) * auVar23._12_4_;
      auVar33 = ZEXT416(*(uint *)((long)pcVar7->m_floats + lVar18));
      auVar23 = vminss_avx(auVar33,auVar27._0_16_);
      auVar27 = ZEXT1664(auVar23);
      auVar23 = vmaxss_avx(auVar33,auVar34._0_16_);
      auVar34 = ZEXT1664(auVar23);
      auVar23 = auVar25;
      auVar33 = auVar24;
    } while (lVar12 * 0x10 != lVar15);
  }
  auVar32._0_4_ = auVar24._0_4_ + auVar25._0_4_;
  auVar32._4_4_ = auVar24._4_4_ + auVar25._4_4_;
  auVar32._8_4_ = auVar24._8_4_ + auVar25._8_4_;
  auVar32._12_4_ = auVar24._12_4_ + auVar25._12_4_;
  fVar29 = auVar34._0_4_ - auVar27._0_4_;
  auVar23 = vblendps_avx(auVar25,auVar24,2);
  auVar33 = vblendps_avx(auVar24,auVar25,2);
  iVar14 = 0x400;
  auVar35 = vsubps_avx(auVar23,auVar33);
  auVar30._0_4_ = auVar26._0_4_ / 1.7320508;
  auVar30._4_12_ = auVar26._4_12_;
  uVar4 = vmovlps_avx(auVar32);
  *(undefined8 *)(this->mC).m_floats = uVar4;
  (this->mC).m_floats[2] = auVar34._0_4_ + auVar27._0_4_;
  (this->mC).m_floats[3] = 0.0;
  auVar33 = vmovshdup_avx(auVar35);
  uVar4 = vmovlps_avx(auVar35);
  *(undefined8 *)(this->mE).m_floats = uVar4;
  (this->mE).m_floats[2] = fVar29;
  (this->mE).m_floats[3] = 0.0;
  auVar23 = vmaxss_avx(auVar33,auVar35);
  uVar17 = 2;
  if (fVar29 <= auVar23._0_4_) {
    uVar17 = (ulong)(auVar35._0_4_ < auVar33._0_4_);
  }
  uVar13 = (ulong)(uint)((int)uVar17 << 2);
  fVar29 = *(float *)((long)(this->mE).m_floats + uVar13);
  (this->m_extents).m_floats[2] = auVar30._0_4_;
  (this->m_extents).m_floats[1] = auVar30._0_4_;
  (this->m_extents).m_floats[0] = auVar30._0_4_;
  fVar28 = fVar29 * 0.5;
  auVar23 = vfmsub213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)fVar29),auVar30);
  *(float *)((long)(this->m_extents).m_floats + uVar13) = fVar28;
  do {
    bVar11 = testContainment(this);
    if (bVar11) {
      uVar19 = 1 << (int)uVar17 & 3;
      uVar20 = 1 << uVar19 & 3;
      fVar29 = (auVar26._0_4_ - auVar30._0_4_) * 0.0009765625;
      local_2c = (this->m_extents).m_floats[uVar20];
      local_30 = (this->m_extents).m_floats[uVar19];
      (this->m_extents).m_floats[uVar19] = fVar29 + local_30;
      local_28 = fVar29 + (this->m_extents).m_floats[uVar20];
      (this->m_extents).m_floats[uVar20] = local_28;
      bVar11 = testContainment(this);
      if (bVar11) {
        iVar14 = 0x400;
        do {
          iVar14 = iVar14 + -1;
          if (iVar14 == 0) {
            return;
          }
          local_2c = local_28;
          local_30 = (this->m_extents).m_floats[uVar19];
          (this->m_extents).m_floats[uVar19] = fVar29 + local_30;
          local_28 = fVar29 + (this->m_extents).m_floats[uVar20];
          (this->m_extents).m_floats[uVar20] = local_28;
          bVar11 = testContainment(this);
        } while (bVar11);
      }
      (this->m_extents).m_floats[uVar19] = local_30;
      (this->m_extents).m_floats[uVar20] = local_2c;
      return;
    }
    iVar14 = iVar14 + -1;
    fVar28 = fVar28 - auVar23._0_4_ * 0.0009765625;
    (this->m_extents).m_floats[uVar17] = fVar28;
  } while (iVar14 != 0);
  (this->m_extents).m_floats[2] = auVar30._0_4_;
  (this->m_extents).m_floats[1] = auVar30._0_4_;
  (this->m_extents).m_floats[0] = auVar30._0_4_;
  return;
}

Assistant:

void cbtConvexPolyhedron::initialize2()
{
	m_localCenter.setValue(0, 0, 0);
	cbtScalar TotalArea = 0.0f;
	for (int i = 0; i < m_faces.size(); i++)
	{
		int numVertices = m_faces[i].m_indices.size();
		int NbTris = numVertices - 2;

		const cbtVector3& p0 = m_vertices[m_faces[i].m_indices[0]];
		for (int j = 1; j <= NbTris; j++)
		{
			int k = (j + 1) % numVertices;
			const cbtVector3& p1 = m_vertices[m_faces[i].m_indices[j]];
			const cbtVector3& p2 = m_vertices[m_faces[i].m_indices[k]];
			cbtScalar Area = ((p0 - p1).cross(p0 - p2)).length() * 0.5f;
			cbtVector3 Center = (p0 + p1 + p2) / 3.0f;
			m_localCenter += Area * Center;
			TotalArea += Area;
		}
	}
	m_localCenter /= TotalArea;

#ifdef TEST_INTERNAL_OBJECTS
	if (1)
	{
		m_radius = FLT_MAX;
		for (int i = 0; i < m_faces.size(); i++)
		{
			const cbtVector3 Normal(m_faces[i].m_plane[0], m_faces[i].m_plane[1], m_faces[i].m_plane[2]);
			const cbtScalar dist = cbtFabs(m_localCenter.dot(Normal) + m_faces[i].m_plane[3]);
			if (dist < m_radius)
				m_radius = dist;
		}

		cbtScalar MinX = FLT_MAX;
		cbtScalar MinY = FLT_MAX;
		cbtScalar MinZ = FLT_MAX;
		cbtScalar MaxX = -FLT_MAX;
		cbtScalar MaxY = -FLT_MAX;
		cbtScalar MaxZ = -FLT_MAX;
		for (int i = 0; i < m_vertices.size(); i++)
		{
			const cbtVector3& pt = m_vertices[i];
			if (pt.x() < MinX) MinX = pt.x();
			if (pt.x() > MaxX) MaxX = pt.x();
			if (pt.y() < MinY) MinY = pt.y();
			if (pt.y() > MaxY) MaxY = pt.y();
			if (pt.z() < MinZ) MinZ = pt.z();
			if (pt.z() > MaxZ) MaxZ = pt.z();
		}
		mC.setValue(MaxX + MinX, MaxY + MinY, MaxZ + MinZ);
		mE.setValue(MaxX - MinX, MaxY - MinY, MaxZ - MinZ);

		//		const cbtScalar r = m_radius / sqrtf(2.0f);
		const cbtScalar r = m_radius / sqrtf(3.0f);
		const int LargestExtent = mE.maxAxis();
		const cbtScalar Step = (mE[LargestExtent] * 0.5f - r) / 1024.0f;
		m_extents[0] = m_extents[1] = m_extents[2] = r;
		m_extents[LargestExtent] = mE[LargestExtent] * 0.5f;
		bool FoundBox = false;
		for (int j = 0; j < 1024; j++)
		{
			if (testContainment())
			{
				FoundBox = true;
				break;
			}

			m_extents[LargestExtent] -= Step;
		}
		if (!FoundBox)
		{
			m_extents[0] = m_extents[1] = m_extents[2] = r;
		}
		else
		{
			// Refine the box
			const cbtScalar Step = (m_radius - r) / 1024.0f;
			const int e0 = (1 << LargestExtent) & 3;
			const int e1 = (1 << e0) & 3;

			for (int j = 0; j < 1024; j++)
			{
				const cbtScalar Saved0 = m_extents[e0];
				const cbtScalar Saved1 = m_extents[e1];
				m_extents[e0] += Step;
				m_extents[e1] += Step;

				if (!testContainment())
				{
					m_extents[e0] = Saved0;
					m_extents[e1] = Saved1;
					break;
				}
			}
		}
	}
#endif
}